

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

void __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::RpcCallContext::sendRedirectReturn
          (RpcCallContext *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  uint uVar2;
  RpcConnectionState *pRVar3;
  Connected *pCVar4;
  Connection *pCVar5;
  OutgoingRpcMessage *pOVar6;
  Array<unsigned_int> local_d0;
  Builder local_b0;
  BuilderFor<capnp::rpc::Message> local_98;
  undefined1 local_70 [8];
  Builder builder;
  Own<capnp::OutgoingRpcMessage,_std::nullptr_t> message;
  Fault f_1;
  DebugExpression<bool> _kjCondition_1;
  Fault local_20;
  Fault f;
  DebugExpression<bool_&> _kjCondition;
  RpcCallContext *this_local;
  
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->redirectResults);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&f);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool&>&>
              (&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0xc94,FAILED,"redirectResults","_kjCondition,",(DebugExpression<bool_&> *)&f);
    kj::_::Debug::Fault::fatal(&local_20);
  }
  f_1.exception._2_1_ = ((this->hints).onlyPromisePipeline ^ 0xffU) & 1;
  f_1.exception._3_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f_1.exception + 2));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool
                    ((DebugExpression *)((long)&f_1.exception + 3));
  if (bVar1) {
    bVar1 = isFirstResponder(this);
    if (bVar1) {
      pRVar3 = kj::Own<capnp::_::RpcSystemBase::RpcConnectionState,_std::nullptr_t>::operator->
                         (&this->connectionState);
      pCVar4 = kj::OneOf<capnp::_::RpcSystemBase::RpcConnectionState::Connected,_kj::Exception>::
               get<capnp::_::RpcSystemBase::RpcConnectionState::Connected>(&pRVar3->connection);
      pCVar5 = kj::Own<capnp::_::VatNetworkBase::Connection,_std::nullptr_t>::operator->
                         (&pCVar4->connection);
      uVar2 = anon_unknown_18::messageSizeHint<capnp::rpc::Return>();
      this_00 = &builder._builder.dataSize;
      (**pCVar5->_vptr_Connection)(this_00,pCVar5,(ulong)uVar2);
      pOVar6 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                         ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)this_00);
      (**pOVar6->_vptr_OutgoingRpcMessage)(&local_b0);
      AnyPointer::Builder::initAs<capnp::rpc::Message>(&local_98,&local_b0);
      rpc::Message::Builder::initReturn((Builder *)local_70,&local_98);
      rpc::Return::Builder::setAnswerId((Builder *)local_70,this->answerId);
      rpc::Return::Builder::setReleaseParamCaps((Builder *)local_70,false);
      rpc::Return::Builder::setResultsSentElsewhere((Builder *)local_70);
      pOVar6 = kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::operator->
                         ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)
                          &builder._builder.dataSize);
      (*pOVar6->_vptr_OutgoingRpcMessage[2])();
      kj::Array<unsigned_int>::Array(&local_d0,(void *)0x0);
      cleanupAnswerTable(this,&local_d0,false);
      kj::Array<unsigned_int>::~Array(&local_d0);
      kj::Own<capnp::OutgoingRpcMessage,_std::nullptr_t>::~Own
                ((Own<capnp::OutgoingRpcMessage,_std::nullptr_t> *)&builder._builder.dataSize);
    }
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&message.ptr,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
             ,0xc95,FAILED,"!hints.onlyPromisePipeline","_kjCondition,",
             (DebugExpression<bool> *)((long)&f_1.exception + 3));
  kj::_::Debug::Fault::fatal((Fault *)&message.ptr);
}

Assistant:

void sendRedirectReturn() {
      KJ_ASSERT(redirectResults);
      KJ_ASSERT(!hints.onlyPromisePipeline);

      if (isFirstResponder()) {
        auto message = connectionState->connection.get<Connected>().connection
            ->newOutgoingMessage(messageSizeHint<rpc::Return>());
        auto builder = message->getBody().initAs<rpc::Message>().initReturn();

        builder.setAnswerId(answerId);
        builder.setReleaseParamCaps(false);
        builder.setResultsSentElsewhere();

        // TODO(perf): Could `noFinishNeeded` be used here? The `Finish` messages are pretty
        //   redundant after a redirect, but as this case is less common and more complicated I
        //   don't want to fully think through the implications right now.

        message->send();

        cleanupAnswerTable(nullptr, false);
      }
    }